

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::handleLengthMethod
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *intermNode)

{
  int iVar1;
  TIntermediate *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar4;
  long lVar5;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermTyped *pTVar6;
  TIntermConstantUnion *pTVar7;
  undefined4 extraout_var_10;
  char *pcVar8;
  char *pcVar9;
  TParseContext *this_02;
  char *pcVar10;
  _func_int **pp_Var11;
  TType local_c8;
  undefined4 extraout_var_06;
  
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (iVar3 < 1) {
    iVar3 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
    type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf0))
                              ((long *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar3 == '\0') {
      iVar3 = (*type->_vptr_TType[0x1c])(type);
      if ((char)iVar3 != '\0') {
        iVar3 = (*type->_vptr_TType[0xd])(type);
        goto LAB_004a4f8f;
      }
      iVar3 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar3 != '\0') {
        iVar3 = (*type->_vptr_TType[0xc])(type);
        goto LAB_004a4f8f;
      }
      if ((*(ushort *)&type->field_0xa & 0x860) != 0) goto LAB_004a4f33;
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar9 = ".length()";
      pcVar8 = "unexpected use of .length()";
      goto LAB_004a4ce3;
    }
    iVar3 = (*type->_vptr_TType[0x1f])();
    if ((char)iVar3 == '\0') {
      iVar3 = (*type->_vptr_TType[0x10])(type);
      if (CONCAT44(extraout_var_04,iVar3) != 0) {
        iVar3 = (*type->_vptr_TType[0x10])();
        return (TIntermTyped *)CONCAT44(extraout_var_05,iVar3);
      }
      iVar3 = (*type->_vptr_TType[0xf])(type);
      goto LAB_004a4f8f;
    }
    iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
    if ((CONCAT44(extraout_var_01,iVar3) == 0) || (bVar2 = isIoResizeArray(this,type), !bVar2)) {
      iVar3 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
      plVar4 = (long *)CONCAT44(extraout_var_06,iVar3);
      if ((plVar4 != (long *)0x0) &&
         (lVar5 = (**(code **)(*plVar4 + 0x108))(plVar4), (*(uint *)(lVar5 + 8) & 0xff80) == 0x2380)
         ) {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,8,
                   "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
        iVar3 = (this->resources).maxSamples;
        iVar1 = iVar3 + 0x1f;
        iVar3 = iVar3 + 0x3e;
        if (-1 < iVar1) {
          iVar3 = iVar1;
        }
        iVar3 = iVar3 >> 5;
        goto LAB_004a4eaf;
      }
    }
    else {
      iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
      this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 400))
                          ((long *)CONCAT44(extraout_var_02,iVar3));
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (this_01,"gl_in");
      if ((((iVar3 == 0) ||
           (iVar3 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_01,"gl_out"), iVar3 == 0)) ||
          (iVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(this_01,"gl_MeshVerticesNV"), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(this_01,"gl_MeshPrimitivesNV"), iVar3 == 0)) {
        iVar3 = (*type->_vptr_TType[0xb])(type);
        iVar3 = getIoArrayImplicitSize
                          (this,(TQualifier *)CONCAT44(extraout_var_03,iVar3),(TString *)0x0);
LAB_004a4eaf:
        if (iVar3 != 0) goto LAB_004a4f8f;
      }
    }
    iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
    if ((CONCAT44(extraout_var_07,iVar3) == 0) || (bVar2 = isIoResizeArray(this,type), !bVar2)) {
      this_02 = (TParseContext *)intermNode;
      iVar3 = (*intermNode->_vptr_TIntermNode[3])();
      bVar2 = isRuntimeLength(this_02,(TIntermTyped *)CONCAT44(extraout_var_09,iVar3));
      if (bVar2) {
LAB_004a4f33:
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TType::TType(&local_c8,EbtInt,EvqTemporary,1,0,0,false);
        pTVar6 = TIntermediate::addBuiltInFunctionCall
                           (this_00,loc,EOpArrayLength,true,intermNode,&local_c8);
        return pTVar6;
      }
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      pcVar8 = *(char **)(CONCAT44(extraout_var_10,iVar3) + 8);
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar9 = "";
      pcVar10 = "array must be declared with a size before using this method";
    }
    else {
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      pcVar8 = *(char **)(CONCAT44(extraout_var_08,iVar3) + 8);
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar9 = "";
      pcVar10 = "array must first be sized by a redeclaration or layout qualifier";
    }
  }
  else {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    pcVar8 = *(char **)(CONCAT44(extraout_var,iVar3) + 8);
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar9 = "method does not accept any arguments";
LAB_004a4ce3:
    pcVar10 = "";
  }
  iVar3 = 0;
  (*pp_Var11[0x2d])(this,loc,pcVar9,pcVar8,pcVar10);
LAB_004a4f8f:
  pTVar7 = TIntermediate::addConstantUnion
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      iVar3 + (uint)(iVar3 == 0),loc,false);
  return &pTVar7->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleLengthMethod(const TSourceLoc& loc, TFunction* function, TIntermNode* intermNode)
{
    int length = 0;

    if (function->getParamCount() > 0)
        error(loc, "method does not accept any arguments", function->getName().c_str(), "");
    else {
        const TType& type = intermNode->getAsTyped()->getType();
        if (type.isArray()) {
            if (type.isUnsizedArray()) {
                if (intermNode->getAsSymbolNode() && isIoResizeArray(type)) {
                    // We could be between a layout declaration that gives a built-in io array implicit size and
                    // a user redeclaration of that array, meaning we have to substitute its implicit size here
                    // without actually redeclaring the array.  (It is an error to use a member before the
                    // redeclaration, but not an error to use the array name itself.)
                    const TString& name = intermNode->getAsSymbolNode()->getName();
                    if (name == "gl_in" || name == "gl_out" || name == "gl_MeshVerticesNV" ||
                        name == "gl_MeshPrimitivesNV") {
                        length = getIoArrayImplicitSize(type.getQualifier());
                    }
                } else if (const auto typed = intermNode->getAsTyped()) {
                    if (typed->getQualifier().builtIn == EbvSampleMask) {
                        requireProfile(loc, EEsProfile, "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
                        length = (resources.maxSamples + 31) / 32;
                    }
                }
                if (length == 0) {
                    if (intermNode->getAsSymbolNode() && isIoResizeArray(type))
                        error(loc, "", function->getName().c_str(), "array must first be sized by a redeclaration or layout qualifier");
                    else if (isRuntimeLength(*intermNode->getAsTyped())) {
                        // Create a unary op and let the back end handle it
                        return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
                    } else
                        error(loc, "", function->getName().c_str(), "array must be declared with a size before using this method");
                }
            } else if (type.getOuterArrayNode()) {
                // If the array's outer size is specified by an intermediate node, it means the array's length
                // was specified by a specialization constant. In such a case, we should return the node of the
                // specialization constants to represent the length.
                return type.getOuterArrayNode();
            } else
                length = type.getOuterArraySize();
        } else if (type.isMatrix())
            length = type.getMatrixCols();
        else if (type.isVector())
            length = type.getVectorSize();
        else if (type.isCoopMat() || type.isCoopVecNV())
            return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
        else {
            // we should not get here, because earlier semantic checking should have prevented this path
            error(loc, ".length()", "unexpected use of .length()", "");
        }
    }

    if (length == 0)
        length = 1;

    return intermediate.addConstantUnion(length, loc);
}